

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

int __thiscall
draco::PointCloud::AddAttribute
          (PointCloud *this,GeometryAttribute *att,bool identity_mapping,
          ValueType num_attribute_values)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined1 in_DL;
  PointCloud *in_RSI;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *in_RDI;
  int32_t att_id;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> pa;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
  *in_stack_ffffffffffffff98;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
  in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ValueType in_stack_ffffffffffffffd8;
  bool in_stack_ffffffffffffffdf;
  undefined3 in_stack_ffffffffffffffe4;
  int local_4;
  
  CreateAttribute(in_RSI,(GeometryAttribute *)
                         (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffe4),in_ECX) &
                         0x1ffffffffffffff),in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      *)0x1c6d4b);
  if (bVar1) {
    std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::unique_ptr
              ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
               &stack0xffffffffffffffc8,in_stack_ffffffffffffff98);
    local_4 = AddAttribute((PointCloud *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                            *)in_stack_ffffffffffffffc8._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
    std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
              (in_RDI);
  }
  else {
    local_4 = -1;
  }
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            (in_RDI);
  return local_4;
}

Assistant:

int PointCloud::AddAttribute(
    const GeometryAttribute &att, bool identity_mapping,
    AttributeValueIndex::ValueType num_attribute_values) {
  auto pa = CreateAttribute(att, identity_mapping, num_attribute_values);
  if (!pa) {
    return -1;
  }
  const int32_t att_id = AddAttribute(std::move(pa));
  return att_id;
}